

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snes_Spc.cpp
# Opt level: O0

void __thiscall Snes_Spc::save_extra(Snes_Spc *this)

{
  int iVar1;
  sample_t_conflict1 *psVar2;
  Snes_Spc *in_RDI;
  sample_t_conflict1 *in;
  sample_t_conflict1 *out;
  sample_t_conflict1 *dsp_end;
  sample_t_conflict1 *main_end;
  sample_t_conflict1 *local_28;
  sample_t_conflict1 *local_20;
  sample_t_conflict1 *local_18;
  sample_t_conflict1 *local_10;
  
  local_10 = (in_RDI->m).buf_end;
  psVar2 = Spc_Dsp::out_pos(&in_RDI->dsp);
  local_18 = psVar2;
  if (((in_RDI->m).buf_begin <= psVar2) && (psVar2 <= local_10)) {
    local_18 = Spc_Dsp::extra(&in_RDI->dsp);
    local_10 = psVar2;
  }
  local_28 = (in_RDI->m).buf_begin;
  iVar1 = sample_count(in_RDI);
  local_20 = (in_RDI->m).extra_buf;
  for (local_28 = local_28 + iVar1; local_28 < local_10; local_28 = local_28 + 1) {
    *local_20 = *local_28;
    local_20 = local_20 + 1;
  }
  local_28 = Spc_Dsp::extra(&in_RDI->dsp);
  for (; local_28 < local_18; local_28 = local_28 + 1) {
    *local_20 = *local_28;
    local_20 = local_20 + 1;
  }
  (in_RDI->m).extra_pos = local_20;
  return;
}

Assistant:

void Snes_Spc::save_extra()
{
	// Get end pointers
	sample_t const* main_end = m.buf_end;     // end of data written to buf
	sample_t const* dsp_end  = dsp.out_pos(); // end of data written to dsp.extra()
	if ( m.buf_begin <= dsp_end && dsp_end <= main_end )
	{
		main_end = dsp_end;
		dsp_end  = dsp.extra(); // nothing in DSP's extra
	}
	
	// Copy any extra samples at these ends into extra_buf
	sample_t* out = m.extra_buf;
	sample_t const* in;
	for ( in = m.buf_begin + sample_count(); in < main_end; in++ )
		*out++ = *in;
	for ( in = dsp.extra(); in < dsp_end ; in++ )
		*out++ = *in;
	
	m.extra_pos = out;
	assert( out <= &m.extra_buf [extra_size] );
}